

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

char * readMacroArg(char name)

{
  uint32_t i;
  char *pcVar1;
  char *pcStack_20;
  uint32_t num;
  char *str;
  char name_local;
  
  if (name == '@') {
    pcStack_20 = macro_GetUniqueIDStr();
  }
  else if (name == '#') {
    pcStack_20 = macro_GetAllArgs();
  }
  else {
    if (name == '<') {
      i = readBracketedMacroArgNum();
      if (i == 0) {
        return (char *)0x0;
      }
      pcVar1 = macro_GetArg(i);
      if (pcVar1 != (char *)0x0) {
        return pcVar1;
      }
      error("Macro argument \'\\<%u>\' not defined\n",(ulong)i);
      return (char *)0x0;
    }
    if (name == '0') {
      error("Invalid macro argument \'\\0\'\n");
      return (char *)0x0;
    }
    if (name < '1' || '9' < name) {
      __assert_fail("name > \'0\' && name <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x314,"readMacroArg");
    }
    pcStack_20 = macro_GetArg((int)name - 0x30);
  }
  if (pcStack_20 == (char *)0x0) {
    error("Macro argument \'\\%c\' not defined\n",(ulong)(uint)(int)name);
  }
  return pcStack_20;
}

Assistant:

static char const *readMacroArg(char name)
{
	char const *str = NULL;

	if (name == '@') {
		str = macro_GetUniqueIDStr();
	} else if (name == '#') {
		str = macro_GetAllArgs();
	} else if (name == '<') {
		uint32_t num = readBracketedMacroArgNum();

		if (num == 0)
			return NULL;
		str = macro_GetArg(num);
		if (!str)
			error("Macro argument '\\<%" PRIu32 ">' not defined\n", num);
		return str;
	} else if (name == '0') {
		error("Invalid macro argument '\\0'\n");
		return NULL;
	} else {
		assert(name > '0' && name <= '9');
		str = macro_GetArg(name - '0');
	}

	if (!str)
		error("Macro argument '\\%c' not defined\n", name);
	return str;
}